

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O3

void __thiscall
mjs::date_object::do_debug_print_extra
          (date_object *this,wostream *os,int param_2,int param_3,int indent)

{
  wostream *pwVar1;
  char buffer [32];
  wchar_t *local_68;
  long local_60;
  long local_58 [2];
  char local_48 [40];
  
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  local_48[0x19] = '\0';
  local_48[0x1a] = '\0';
  local_48[0x1b] = '\0';
  local_48[0x1c] = '\0';
  local_48[0x1d] = '\0';
  local_48[0x1e] = '\0';
  local_48[0x1f] = '\0';
  builtin_strncpy(local_48,"Invalid Date",0xd);
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  if (!NAN(this->value_)) {
    snprintf(local_48,0x20,"%.17g");
  }
  local_68 = (wchar_t *)local_58;
  std::__cxx11::wstring::_M_construct((ulong)&local_68,indent);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_68,local_60);
  pwVar1 = std::operator<<(pwVar1,"[[Value]]: ");
  pwVar1 = std::operator<<(pwVar1,local_48);
  std::operator<<(pwVar1,"\n");
  if (local_68 != (wchar_t *)local_58) {
    operator_delete(local_68,local_58[0] * 4 + 4);
  }
  return;
}

Assistant:

void do_debug_print_extra(std::wostream& os, int, int, int indent) const override {
        char buffer[32] = "Invalid Date";
        if (!std::isnan(value_)) {
            std::snprintf(buffer, sizeof(buffer), "%.17g", value_);
        }
        os << std::wstring(indent, ' ') << "[[Value]]: " << buffer << "\n";
    }